

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# SystemInterface.cpp
# Opt level: O0

void __thiscall
Rml::SystemInterface::JoinPath
          (SystemInterface *this,String *translated_path,String *document_path,String *path)

{
  long lVar1;
  char *pcVar2;
  unsigned_long a;
  unsigned_long b;
  String local_2c8;
  String local_2a8;
  String local_288;
  String local_268;
  String local_248;
  String local_228;
  basic_string<char,_std::char_traits<char>,_std::allocator<char>_> local_208;
  undefined1 local_1e8 [8];
  URL url;
  size_t file_start;
  String local_98;
  String local_78;
  unsigned_long local_58;
  size_t slash_pos;
  size_t drive_pos;
  String *local_28;
  String *path_local;
  String *document_path_local;
  String *translated_path_local;
  SystemInterface *this_local;
  
  local_28 = path;
  path_local = document_path;
  document_path_local = translated_path;
  translated_path_local = (String *)this;
  lVar1 = ::std::__cxx11::string::size();
  if ((lVar1 != 0) &&
     (pcVar2 = (char *)::std::__cxx11::string::operator[]((ulong)local_28), *pcVar2 == '/')) {
    ::std::__cxx11::string::substr((ulong)&drive_pos,(ulong)local_28);
    ::std::__cxx11::string::operator=((string *)document_path_local,(string *)&drive_pos);
    ::std::__cxx11::string::~string((string *)&drive_pos);
    return;
  }
  slash_pos = ::std::__cxx11::string::find((char)local_28,0x3a);
  a = ::std::__cxx11::string::find((char)local_28,0x2f);
  b = ::std::__cxx11::string::find((char)local_28,0x5c);
  local_58 = Math::Min<unsigned_long>(a,b);
  if ((slash_pos == 0xffffffffffffffff) || (local_58 <= slash_pos)) {
    ::std::__cxx11::string::operator=((string *)document_path_local,(string *)path_local);
    ::std::__cxx11::string::string((string *)&local_98,(string *)document_path_local);
    StringUtilities::Replace(&local_78,&local_98,'\\','/');
    ::std::__cxx11::string::operator=((string *)document_path_local,(string *)&local_78);
    ::std::__cxx11::string::~string((string *)&local_78);
    ::std::__cxx11::string::~string((string *)&local_98);
    url._304_8_ = ::std::__cxx11::string::rfind((char)document_path_local,0x2f);
    if (url._304_8_ == -1) {
      ::std::__cxx11::string::clear();
    }
    else {
      ::std::__cxx11::string::resize((ulong)document_path_local);
    }
    ::std::__cxx11::string::string((string *)&local_248,(string *)document_path_local);
    StringUtilities::Replace(&local_228,&local_248,':','|');
    ::std::__cxx11::string::string((string *)&local_288,(string *)local_28);
    StringUtilities::Replace(&local_268,&local_288,'\\','/');
    ::std::operator+(&local_208,&local_228,&local_268);
    URL::URL((URL *)local_1e8,&local_208);
    ::std::__cxx11::string::~string((string *)&local_208);
    ::std::__cxx11::string::~string((string *)&local_268);
    ::std::__cxx11::string::~string((string *)&local_288);
    ::std::__cxx11::string::~string((string *)&local_228);
    ::std::__cxx11::string::~string((string *)&local_248);
    URL::GetPathedFileName_abi_cxx11_(&local_2c8,(URL *)local_1e8);
    StringUtilities::Replace(&local_2a8,&local_2c8,'|',':');
    ::std::__cxx11::string::operator=((string *)document_path_local,(string *)&local_2a8);
    ::std::__cxx11::string::~string((string *)&local_2a8);
    ::std::__cxx11::string::~string((string *)&local_2c8);
    URL::~URL((URL *)local_1e8);
  }
  else {
    ::std::__cxx11::string::operator=((string *)document_path_local,(string *)local_28);
  }
  return;
}

Assistant:

void SystemInterface::JoinPath(String& translated_path, const String& document_path, const String& path)
{
	// If the path is absolute, strip the leading / and return it.
	if (path.size() > 0 && path[0] == '/')
	{
		translated_path = path.substr(1);
		return;
	}

	// If the path is a Windows-style absolute path, return it directly.
	size_t drive_pos = path.find(':');
	size_t slash_pos = Math::Min(path.find('/'), path.find('\\'));
	if (drive_pos != String::npos && drive_pos < slash_pos)
	{
		translated_path = path;
		return;
	}

	using StringUtilities::Replace;

	// Strip off the referencing document name.
	translated_path = document_path;
	translated_path = Replace(translated_path, '\\', '/');
	size_t file_start = translated_path.rfind('/');
	if (file_start != String::npos)
		translated_path.resize(file_start + 1);
	else
		translated_path.clear();

	// Append the paths and send through URL to removing any '..'.
	URL url(Replace(translated_path, ':', '|') + Replace(path, '\\', '/'));
	translated_path = Replace(url.GetPathedFileName(), '|', ':');
}